

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_strlen(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  uint in_EAX;
  int iValue;
  int iLen;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  if (nArg < 1) {
    iValue = 0;
  }
  else {
    jx9_value_to_string(*apArg,(int *)((long)&uStack_18 + 4));
    iValue = uStack_18._4_4_;
  }
  jx9_result_int(pCtx,iValue);
  return 0;
}

Assistant:

static int jx9Builtin_strlen(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	int iLen = 0;
	if( nArg > 0 ){
		jx9_value_to_string(apArg[0], &iLen);
	}
	/* String length */
	jx9_result_int(pCtx, iLen);
	return JX9_OK;
}